

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeMassMatrix(ChElementShellReissner4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  long lVar6;
  ChMatrixNM<double,_24,_24> *this_00;
  ulong uVar7;
  long row;
  double in_XMM0_Qa;
  undefined1 auVar8 [16];
  Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
  local_190 [3];
  ChMatrix33<double> Rot;
  ChMatrix33<double> inertia_n;
  ChMatrix33<double> Rot_I;
  ChMatrix33<double> box_inertia;
  
  this_00 = &this->m_MassMatrix;
  Eigen::DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_> *)this_00);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x29])(this);
  dVar1 = this->tot_thickness;
  row = 0;
  lVar6 = 0;
  for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
    dVar2 = in_XMM0_Qa * dVar1 * this->alpha_i[uVar7 ^ 2];
    auVar8._0_8_ = this->m_lenX * this->m_lenX;
    auVar8._8_8_ = this->m_lenY * this->m_lenY;
    auVar4 = vshufpd_avx(auVar8,auVar8,1);
    dVar3 = this->tot_thickness * this->tot_thickness;
    Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         dVar2 * (auVar8._0_8_ + auVar8._8_8_) * 0.08333333333333333 * 0.25;
    Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         dVar2 * (dVar3 + auVar4._0_8_) * 0.08333333333333333 * 0.25;
    Rot.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         dVar2 * (dVar3 + auVar4._8_8_) * 0.08333333333333333 * 0.25;
    ChMatrix33<double>::ChMatrix33(&box_inertia,(ChVector<double> *)&Rot);
    Rot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&this->T_i[uVar7 ^ 2].super_Matrix<double,_3,_3,_1,_3,_3>;
    Rot_I.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(*(long *)((long)&(((this->m_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar6) + 0x58);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Rot,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&Rot_I);
    inertia_n.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)&Rot;
    inertia_n.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)&box_inertia;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&Rot_I,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&inertia_n);
    local_190[0].m_lhs = (LhsNested)&Rot_I;
    local_190[0].m_rhs.m_matrix = (non_const_type)&Rot;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,0>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)&inertia_n,local_190);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)this_00,row,
                        row);
    *pSVar5 = dVar2;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)this_00,
                        row + 1,row + 1);
    *pSVar5 = dVar2;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_1> *)this_00,
                        row + 2,row + 2);
    *pSVar5 = dVar2;
    Eigen::Block<Eigen::Matrix<double,_24,_24,_1,_24,_24>,_-1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_24,_1,_24,_24>,__1,__1,_false> *)local_190,this_00,
               row + 3,row + 3,3,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,24,1,24,24>,_1,_1,false>,Eigen::Matrix<double,3,3,1,3,3>>
              ((Block<Eigen::Matrix<double,_24,_24,_1,_24,_24>,__1,__1,_false> *)local_190,
               (Matrix<double,_3,_3,_1,_3,_3> *)&inertia_n);
    lVar6 = lVar6 + 0x10;
    row = row + 6;
  }
  return;
}

Assistant:

void ChElementShellReissner4::ComputeMassMatrix() {
    m_MassMatrix.setZero();

    // loop over all layers, to compute total "mass per area" = sum(rho_i*thickness_i) = average_rho * sum(thickness_i)
    double avg_density = this->GetDensity();
    double mass_per_area = avg_density * tot_thickness;

    // Heuristic, simplified 'lumped' mass matrix.
    // Split the mass in 4 pieces, weighting as the jacobian at integration point, but
    // lump at the node closest to integration point.
    // This is simpler than the stiffness-consistent mass matrix that would require
    // integration over gauss points.

    for (int n = 0; n < NUMNODES; n++) {
        int igp = (n + 2) % 4;  // id of closest gauss point to node
        double jacobian =
            alpha_i[igp];  // weight: jacobian at gauss point (another,brute force,option would be 0.25 for all nodes)

        double nodemass = (jacobian * mass_per_area);

        // Approximate (!) inertia of a quarter of tile, note *(1/4) because only the quarter tile,
        // in local system of Gauss point
        double Ixx = (pow(this->GetLengthY(), 2) + pow(tot_thickness, 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        double Iyy = (pow(this->GetLengthX(), 2) + pow(tot_thickness, 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        double Izz = (pow(this->GetLengthX(), 2) + pow(this->GetLengthY(), 2)) * (1. / 12.) * (1. / 4.) * nodemass;
        ChMatrix33<> box_inertia(ChVector<>(Ixx, Iyy, Izz));
        // ..and rotate inertia in local system of node: (local because ystem-level rotational coords of nodes are
        // ang.vel in loc sys)
        // I' = A'* T * I * T' * A
        //    = Rot * I * Rot'
        ChMatrix33<> Rot = m_nodes[n]->GetA().transpose() * T_i[igp];
        ChMatrix33<> Rot_I(Rot * box_inertia);
        ChMatrix33<> inertia_n;
        inertia_n = Rot_I * Rot.transpose();

        int node_off = n * 6;
        m_MassMatrix(node_off + 0, node_off + 0) = nodemass;
        m_MassMatrix(node_off + 1, node_off + 1) = nodemass;
        m_MassMatrix(node_off + 2, node_off + 2) = nodemass;
        m_MassMatrix.block(node_off + 3, node_off + 3, 3, 3) = inertia_n;

    }  // end loop on nodes
}